

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_internal.cc
# Opt level: O0

bool __thiscall
absl::lts_20240722::status_internal::StatusRep::operator==(StatusRep *this,StatusRep *other)

{
  InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
  *this_00;
  Payloads *this_01;
  bool bVar1;
  __type _Var2;
  size_type sVar3;
  size_type sVar4;
  const_iterator pPVar5;
  const_iterator pPVar6;
  InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
  *local_f0;
  InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
  *local_e8;
  Payload *other_payload;
  const_iterator __end3;
  const_iterator __begin3;
  Payloads *__range3;
  bool found;
  Payload *payload;
  const_iterator __end2;
  const_iterator __begin2;
  Payloads *__range2;
  InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
  *local_78;
  Payloads *smaller_payloads;
  Payloads *larger_payloads;
  Payloads no_payloads;
  Payloads *other_payloads;
  Payloads *this_payloads;
  StatusRep *other_local;
  StatusRep *this_local;
  
  if (this == other) {
    __assert_fail("this != &other",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/status/internal/status_internal.cc"
                  ,0x9d,"bool absl::status_internal::StatusRep::operator==(const StatusRep &) const"
                 );
  }
  if (this->code_ == other->code_) {
    bVar1 = std::operator!=(&this->message_,&other->message_);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      local_e8 = std::
                 unique_ptr<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>,_std::default_delete<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_>_>
                 ::get(&this->payloads_);
      no_payloads.storage_.data_._40_8_ =
           std::
           unique_ptr<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>,_std::default_delete<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_>_>
           ::get(&other->payloads_);
      InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
      ::InlinedVector((InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
                       *)&larger_payloads);
      if (local_e8 == (pointer)0x0) {
        local_e8 = (InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
                    *)&larger_payloads;
      }
      smaller_payloads = local_e8;
      if (no_payloads.storage_.data_._40_8_ == 0) {
        local_f0 = (InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
                    *)&larger_payloads;
      }
      else {
        local_f0 = (InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
                    *)no_payloads.storage_.data_._40_8_;
      }
      local_78 = local_f0;
      sVar3 = InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
              ::size(local_e8);
      sVar4 = InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
              ::size(local_78);
      if (sVar3 < sVar4) {
        std::
        swap<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,1ul,std::allocator<absl::lts_20240722::status_internal::Payload>>const*>
                  (&smaller_payloads,&local_78);
      }
      sVar3 = InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
              ::size(smaller_payloads);
      sVar4 = InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
              ::size(local_78);
      this_01 = smaller_payloads;
      if (sVar3 - sVar4 < 2) {
        __end2 = InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
                 ::begin(smaller_payloads);
        pPVar5 = InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
                 ::end(this_01);
        for (; this_00 = local_78, __end2 != pPVar5; __end2 = __end2 + 1) {
          bVar1 = false;
          __end3 = InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
                   ::begin(local_78);
          pPVar6 = InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
                   ::end(this_00);
          for (; __end3 != pPVar6; __end3 = __end3 + 1) {
            _Var2 = std::operator==(&__end2->type_url,&__end3->type_url);
            if (_Var2) {
              bVar1 = operator!=(&__end2->payload,&__end3->payload);
              if (bVar1) {
                this_local._7_1_ = false;
                goto LAB_00114761;
              }
              bVar1 = true;
              break;
            }
          }
          if (!bVar1) {
            this_local._7_1_ = false;
            goto LAB_00114761;
          }
        }
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
LAB_00114761:
      InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
      ::~InlinedVector((InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
                        *)&larger_payloads);
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool StatusRep::operator==(const StatusRep& other) const {
  assert(this != &other);
  if (code_ != other.code_) return false;
  if (message_ != other.message_) return false;
  const status_internal::Payloads* this_payloads = payloads_.get();
  const status_internal::Payloads* other_payloads = other.payloads_.get();

  const status_internal::Payloads no_payloads;
  const status_internal::Payloads* larger_payloads =
      this_payloads ? this_payloads : &no_payloads;
  const status_internal::Payloads* smaller_payloads =
      other_payloads ? other_payloads : &no_payloads;
  if (larger_payloads->size() < smaller_payloads->size()) {
    std::swap(larger_payloads, smaller_payloads);
  }
  if ((larger_payloads->size() - smaller_payloads->size()) > 1) return false;
  // Payloads can be ordered differently, so we can't just compare payload
  // vectors.
  for (const auto& payload : *larger_payloads) {

    bool found = false;
    for (const auto& other_payload : *smaller_payloads) {
      if (payload.type_url == other_payload.type_url) {
        if (payload.payload != other_payload.payload) {
          return false;
        }
        found = true;
        break;
      }
    }
    if (!found) return false;
  }
  return true;
}